

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.c
# Opt level: O0

int find_and_inc_call_matching(mmk_mock_ctx *mock,void *params,size_t size)

{
  int iVar1;
  size_t *times;
  long *plStack_30;
  int res;
  void *p;
  size_t size_local;
  void *params_local;
  mmk_mock_ctx *mock_local;
  
  plStack_30 = (long *)mmk_mock_params_begin(mock);
  while( true ) {
    if (plStack_30 == (long *)0x0) {
      return 0;
    }
    iVar1 = mmk_memcmp(plStack_30 + 1,(void *)((long)params + 8),size - 8);
    if (iVar1 == 0) break;
    plStack_30 = (long *)mmk_mock_params_next(mock,plStack_30);
  }
  *plStack_30 = *plStack_30 + 1;
  return 1;
}

Assistant:

static int find_and_inc_call_matching(struct mmk_mock_ctx *mock,
        void *params, size_t size)
{
    // skip .times field
    params = (void*) ((char *) params + sizeof (size_t));
    size -= sizeof (size_t);

    for (void *p = mmk_mock_params_begin(mock); p;
            p = mmk_mock_params_next(mock, p))
    {
        // compare parameters w/o .times
        int res = mmk_memcmp((char *) p + sizeof (size_t), params, size);
        if (!res) {
            size_t *times = p;
            ++*times;
            return 1;
        }
    }
    return 0;
}